

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O2

int parse_ptl(GetBitContext *gb,PTL *ptl,int max_num_sub_layers)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  PTLCommon *ptl_00;
  char *__format;
  ulong uVar8;
  uint8_t *puVar9;
  long lVar10;
  
  iVar3 = decode_profile_tier_level(gb,&ptl->general_ptl);
  if ((iVar3 < 0) ||
     (uVar5 = gb->index,
     (int)(gb->size_in_bits - uVar5) < (int)((uint)(1 < max_num_sub_layers) << 4 | 8))) {
    fwrite("PTL information too short\n",0x1a,1,_stderr);
LAB_00105373:
    iVar3 = -1;
  }
  else {
    uVar2 = *(uint *)(gb->buffer + (uVar5 >> 3));
    uVar4 = max_num_sub_layers - 1;
    uVar6 = uVar5 + 8;
    if (gb->size_in_bits_plus8 < uVar5 + 8) {
      uVar6 = gb->size_in_bits_plus8;
    }
    gb->index = uVar6;
    (ptl->general_ptl).level_idc =
         (uint8_t)(((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
                    ) << ((byte)uVar5 & 7)) >> 0x18);
    puVar9 = ptl->sub_layer_profile_present_flag;
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar4) {
      uVar8 = (ulong)uVar4;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      uVar5 = gb->index;
      uVar1 = gb->buffer[uVar5 >> 3];
      gb->index = uVar5 + (uVar5 < gb->size_in_bits_plus8);
      puVar9[uVar7] = (byte)(uVar1 << ((byte)uVar5 & 7)) >> 7;
      uVar5 = gb->index;
      uVar1 = gb->buffer[uVar5 >> 3];
      gb->index = uVar5 + (uVar5 < gb->size_in_bits_plus8);
      ptl->sub_layer_level_present_flag[uVar7] = (byte)(uVar1 << ((byte)uVar5 & 7)) >> 7;
    }
    if (1 < max_num_sub_layers) {
      for (; (int)uVar4 < 8; uVar4 = uVar4 + 1) {
        uVar5 = gb->index + 2;
        if (gb->size_in_bits_plus8 < uVar5) {
          uVar5 = gb->size_in_bits_plus8;
        }
        gb->index = uVar5;
      }
    }
    ptl_00 = ptl->sub_layer_ptl;
    for (lVar10 = 0; -lVar10 != uVar8; lVar10 = lVar10 + -1) {
      if (*puVar9 != '\0') {
        iVar3 = decode_profile_tier_level(gb,ptl_00);
        if (-1 < iVar3) goto LAB_001052c4;
        __format = "PTL information for sublayer %i too short\n";
LAB_00105369:
        fprintf(_stderr,__format,(ulong)(uint)-(int)lVar10);
        goto LAB_00105373;
      }
LAB_001052c4:
      if (puVar9[7] != '\0') {
        uVar5 = gb->index;
        if ((int)(gb->size_in_bits - uVar5) < 8) {
          __format = "Not enough data for sublayer %i level_idc\n";
          goto LAB_00105369;
        }
        uVar4 = *(uint *)(gb->buffer + (uVar5 >> 3));
        uVar2 = uVar5 + 8;
        if (gb->size_in_bits_plus8 < uVar5 + 8) {
          uVar2 = gb->size_in_bits_plus8;
        }
        gb->index = uVar2;
        ptl_00->level_idc =
             (uint8_t)(((uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                        uVar4 << 0x18) << ((byte)uVar5 & 7)) >> 0x18);
      }
      puVar9 = puVar9 + 1;
      ptl_00 = ptl_00 + 1;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int parse_ptl(GetBitContext *gb, PTL *ptl, int max_num_sub_layers)
{
    int i;
    if (decode_profile_tier_level(gb, &ptl->general_ptl) < 0 || get_bits_left(gb) < 8 + (8 * 2 * (max_num_sub_layers - 1 > 0))) {
        fprintf(stderr, "PTL information too short\n");
        return -1;
    }

    ptl->general_ptl.level_idc = (uint8_t)get_bits(gb, 8);

    for (i = 0; i < max_num_sub_layers - 1; i++)
    {
        ptl->sub_layer_profile_present_flag[i] = (uint8_t)get_bits1(gb);
        ptl->sub_layer_level_present_flag[i]   = (uint8_t)get_bits1(gb);
    }

    if (max_num_sub_layers > 1)
        for (i = max_num_sub_layers - 1; i < 8; i++)
            skip_bits(gb, 2); // reserved_zero_2bits[i]
    for (i = 0; i < max_num_sub_layers - 1; i++)
    {
        if (ptl->sub_layer_profile_present_flag[i] && decode_profile_tier_level(gb, &ptl->sub_layer_ptl[i]) < 0)
        {
            fprintf(stderr, "PTL information for sublayer %i too short\n", i);
            return -1;
        }
        if (ptl->sub_layer_level_present_flag[i])
        {
            if (get_bits_left(gb) < 8)
            {
                fprintf(stderr, "Not enough data for sublayer %i level_idc\n", i);
                return -1;
            }
            else
                ptl->sub_layer_ptl[i].level_idc = (uint8_t)get_bits(gb, 8);
        }
    }

    return 0;
}